

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O1

WJTL_STATUS TestUnmarshallStructFixArray(void)

{
  JL_STATUS JVar1;
  int iVar2;
  int iVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  WJTL_STATUS WVar6;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  bool Condition_02;
  size_t errorAtPos;
  JlMarshallElement marshalTheStruct [1];
  TheStruct theStruct;
  JlMarshallElement marshalMiniStruct [2];
  size_t local_1b0;
  JlMarshallElement local_1a8;
  long local_148;
  char *pcStack_140;
  long local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  long local_108;
  JlMarshallElement local_f8 [2];
  
  WVar6 = WJTL_STATUS_SUCCESS;
  local_1b0 = 0;
  memcpy(local_f8,&DAT_001416b0,0xc0);
  local_1a8.Type = JL_DATA_TYPE_DICTIONARY;
  local_1a8.Name = "MiniFixList";
  local_1a8.IsArray = true;
  local_1a8.FieldOffset = 0;
  local_1a8.FieldSize = 0x40;
  local_1a8.CountFieldOffset = 0x40;
  local_1a8.CountFieldSize = 8;
  local_1a8.ArrayFieldSize = 0x40;
  local_1a8.ArrayItemSize = 0x10;
  local_1a8.NumberType = JL_NUM_TYPE_NONE;
  local_1a8.IsHex = false;
  local_1a8.IsBase64 = false;
  local_1a8.ChildStructDescriptionCount = 2;
  local_108 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  pcStack_130 = (char *)0x0;
  local_148 = 0;
  pcStack_140 = (char *)0x0;
  local_1a8.ChildStructDescription = local_f8;
  JVar1 = JlJsonToStruct("{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }"
                         ,&local_1a8,1,&local_148,&local_1b0);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{ \\\"MiniFixList\\\": [ {\\\"XNum\\\":501,\\\"XStr\\\":\\\"501\\\"}, {\\\"XNum\\\":601,\\\"XStr\\\":\\\"601\\\"} ] }\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x548);
  Condition = local_1b0 == 0;
  WjTestLib_Assert(Condition,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x549);
  Condition_00 = local_108 == 2;
  WjTestLib_Assert(Condition_00,"2 == theStruct.StructFixArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54b);
  Condition_01 = local_148 == 0x1f5;
  WjTestLib_Assert(Condition_01,"501 == theStruct.StructFixArray[0].XNum",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54c);
  iVar2 = strcmp(pcStack_140,"501");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"501\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54d);
  Condition_02 = local_138 == 0x259;
  WjTestLib_Assert(Condition_02,"601 == theStruct.StructFixArray[1].XNum",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54e);
  iVar3 = strcmp(pcStack_130,"601");
  WjTestLib_Assert(iVar3 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"601\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54f);
  JVar4 = JlUnmarshallFreeStructAllocs(&local_1a8,1,&local_148);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x551);
  JVar5 = JlJsonToStruct("{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"},{\"XNum\":701,\"XStr\":\"701\"}, {\"XNum\":801,\"XStr\":\"801\"},{\"XNum\":901,\"XStr\":\"901\"} ] }"
                         ,&local_1a8,1,&local_148,&local_1b0);
  WjTestLib_Assert(JVar5 == JL_STATUS_TOO_MANY_ITEMS,
                   "(JlJsonToStruct( \"{ \\\"MiniFixList\\\": [ {\\\"XNum\\\":501,\\\"XStr\\\":\\\"501\\\"}, {\\\"XNum\\\":601,\\\"XStr\\\":\\\"601\\\"},\" \"{\\\"XNum\\\":701,\\\"XStr\\\":\\\"701\\\"}, {\\\"XNum\\\":801,\\\"XStr\\\":\\\"801\\\"},{\\\"XNum\\\":901,\\\"XStr\\\":\\\"901\\\"} ] }\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_TOO_MANY_ITEMS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x557);
  if (!Condition_02 ||
      ((!Condition_01 || (!Condition_00 || !Condition)) ||
      (((iVar2 != 0 || JVar1 != JL_STATUS_SUCCESS) || iVar3 != 0) || JVar4 != JL_STATUS_SUCCESS))) {
    WVar6 = WJTL_STATUS_FAILED;
  }
  if (local_1b0 != 0x11) {
    WVar6 = WJTL_STATUS_FAILED;
  }
  if (JVar5 != JL_STATUS_TOO_MANY_ITEMS) {
    WVar6 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(local_1b0 == 0x11,"17 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x558);
  return WVar6;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallStructFixArray
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint64_t    XNum;
        char*       XStr;
    } MiniStruct;

    typedef struct
    {
        MiniStruct  StructFixArray[4];
        size_t      StructFixArrayCount;
    } TheStruct;

    JlMarshallElement marshalMiniStruct[] = {
        JlMarshallUnsigned( MiniStruct, XNum, "XNum" ),
        JlMarshallString( MiniStruct, XStr, "XStr" ),
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStructFixedArray( TheStruct, StructFixArray, StructFixArrayCount, "MiniFixList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
    };

    TheStruct theStruct = {{{0}}};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }",
            marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( 2 == theStruct.StructFixArrayCount );
    JL_ASSERT( 501 == theStruct.StructFixArray[0].XNum );
    JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "501" ) == 0 );
    JL_ASSERT( 601 == theStruct.StructFixArray[1].XNum );
    JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "601" ) == 0 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    // Try with too much data
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"},"
        "{\"XNum\":701,\"XStr\":\"701\"}, {\"XNum\":801,\"XStr\":\"801\"},{\"XNum\":901,\"XStr\":\"901\"} ] }",
            marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ), JL_STATUS_TOO_MANY_ITEMS );
    JL_ASSERT( 17 == errorAtPos );

    return TestReturn;
}